

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O2

void __thiscall
XPMP2::SoundSystemFMOD::SetPosOrientation
          (SoundSystemFMOD *this,uint64_t sndId,Aircraft *ac,bool bDoOrientation)

{
  FMOD_RESULT FVar1;
  bool bVar2;
  SoundChannel *pSVar3;
  float fVar4;
  allocator<char> local_127;
  allocator<char> local_126;
  allocator<char> local_125;
  float local_124;
  float local_120;
  float local_11c;
  string local_118;
  string local_f8;
  string local_d8;
  FMOD_VECTOR local_b8;
  FmodError local_a8;
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float local_30;
  
  pSVar3 = SoundSystem::GetChn(&this->super_SoundSystem,sndId);
  if (((pSVar3 != (SoundChannel *)0x0) && (pSVar3->pChn != (FMOD_CHANNEL *)0x0)) &&
     (pSVar3->pSnd != (SoundFile *)0x0)) {
    local_38._0_4_ = (ac->drawInfo).x;
    local_38._4_4_ = (ac->drawInfo).y;
    local_30 = (ac->drawInfo).z;
    local_48._0_4_ = ac->v_x;
    local_48._4_4_ = ac->v_y;
    local_40 = ac->v_z;
    gFmodRes = FMOD_Channel_Set3DAttributes();
    if (gFmodRes != FMOD_OK) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"FMOD_Channel_Set3DAttributes(pChn->pChn, &fmodPos, &fmodVel)",
                 (allocator<char> *)&local_b8);
      FVar1 = gFmodRes;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,&local_126);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"SetPosOrientation",&local_127);
      FmodError::FmodError(&local_a8,&local_d8,FVar1,&local_f8,0x175,&local_118);
      FmodError::LogErr(&local_a8);
      FmodError::~FmodError(&local_a8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    if (bDoOrientation) {
      bVar2 = SoundFile::hasConeInfo(pSVar3->pSnd);
      if (bVar2) {
        local_11c = pSVar3->pSnd->coneDir;
        local_124 = (local_11c * 3.1415927) / 180.0;
        local_11c = local_11c + (ac->drawInfo).heading;
        local_120 = cosf(local_124);
        local_120 = local_120 * (ac->drawInfo).pitch;
        fVar4 = sinf(local_124);
        local_b8 = FmodHeadPitch2Vec(local_11c,
                                     (local_120 - fVar4 * (ac->drawInfo).roll) +
                                     pSVar3->pSnd->conePitch);
        gFmodRes = FMOD_Channel_Set3DConeOrientation(pSVar3->pChn);
        if (gFmodRes != FMOD_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"FMOD_Channel_Set3DConeOrientation(pChn->pChn, &coneVec)",
                     &local_126);
          FVar1 = gFmodRes;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                     ,&local_127);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"SetPosOrientation",&local_125);
          FmodError::FmodError(&local_a8,&local_d8,FVar1,&local_f8,0x181,&local_118);
          FmodError::LogErr(&local_a8);
          FmodError::~FmodError(&local_a8);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_d8);
        }
      }
    }
  }
  return;
}

Assistant:

void SoundSystemFMOD::SetPosOrientation (uint64_t sndId, const Aircraft& ac, bool bDoOrientation)
{
    SoundChannel* pChn = GetChn(sndId);
    if (!pChn || !pChn->pChn || !pChn->pSnd ) return;
    
    // Aircraft position and velocity
    FMOD_VECTOR fmodPos {                           // Copy of the aircraft's 3D location
        ac.drawInfo.x,
        ac.drawInfo.y,
        ac.drawInfo.z,
    };
    FMOD_VECTOR fmodVel { ac.v_x, ac.v_y, ac.v_z }; // Copy of the aircraft's relative speed
    FMOD_LOG(FMOD_Channel_Set3DAttributes(pChn->pChn, &fmodPos, &fmodVel));
    
    // Do the (computationally more expensive) orientation stuff?
    if (!bDoOrientation ||
        !pChn->pSnd->hasConeInfo()) return;
    
    // Calculate current cone orientation based on standard orientation and aircraft orientation
    const float coneDirRad = deg2rad(pChn->pSnd->coneDir);
    FMOD_VECTOR coneVec = FmodHeadPitch2Vec(ac.GetHeading() + pChn->pSnd->coneDir,
                                            std::cos(coneDirRad)*ac.GetPitch() - std::sin(coneDirRad)*ac.GetRoll() + pChn->pSnd->conePitch);

    // Set cone info and orientation
    FMOD_LOG(FMOD_Channel_Set3DConeOrientation(pChn->pChn, &coneVec));
}